

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::try_statement::~try_statement(try_statement *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  statement *psVar2;
  pointer pwVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__try_statement_001d08a8;
  psVar2 = (this->finally_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar2 != (statement *)0x0) {
    (**(code **)((long)(psVar2->super_syntax_node)._vptr_syntax_node + 8))();
  }
  (this->finally_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  pwVar3 = (this->catch_id_)._M_dataplus._M_p;
  paVar1 = &(this->catch_id_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar3 != paVar1) {
    operator_delete(pwVar3,paVar1->_M_allocated_capacity * 4 + 4);
  }
  psVar2 = (this->catch_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar2 != (statement *)0x0) {
    (**(code **)((long)(psVar2->super_syntax_node)._vptr_syntax_node + 8))();
  }
  (this->catch_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  psVar2 = (this->block_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar2 != (statement *)0x0) {
    (**(code **)((long)(psVar2->super_syntax_node)._vptr_syntax_node + 8))();
  }
  (this->block_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001d0110;
  this_00 = (this->super_statement).super_syntax_node.extend_.file.
            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

explicit try_statement(const source_extend& extend, statement_ptr&& block, statement_ptr&& catch_, const std::wstring& catch_id, statement_ptr&& finally_)
        : statement(extend)
        , block_(std::move(block))
        , catch_(std::move(catch_))
        , catch_id_(catch_id)
        , finally_(std::move(finally_)) {
        assert(block_ && block_->type() == statement_type::block);
        assert(!this->catch_ == catch_id_.empty());
        assert(!this->catch_ || this->catch_->type() == statement_type::block);
        assert(!this->finally_ || this->finally_->type() == statement_type::block);
    }